

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_rune nk_utf_decode_byte(char c,int *i)

{
  int *i_local;
  char c_local;
  
  if (i == (int *)0x0) {
    __assert_fail("i",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x1e72,"nk_rune nk_utf_decode_byte(char, int *)");
  }
  if (i != (int *)0x0) {
    *i = 0;
    while (*i < 5) {
      if ((c & nk_utfmask[*i]) == nk_utfbyte[*i]) {
        return (int)c & (nk_utfmask[*i] ^ 0xffffffff) & 0xff;
      }
      *i = *i + 1;
    }
  }
  return 0;
}

Assistant:

NK_INTERN nk_rune
nk_utf_decode_byte(char c, int *i)
{
    NK_ASSERT(i);
    if (!i) return 0;
    for(*i = 0; *i < (int)NK_LEN(nk_utfmask); ++(*i)) {
        if (((nk_byte)c & nk_utfmask[*i]) == nk_utfbyte[*i])
            return (nk_byte)(c & ~nk_utfmask[*i]);
    }
    return 0;
}